

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::get_7(disp *this,int a,int b,int c,int d,int e,int f,int g)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *__lhs;
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [48];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [28];
  int in_stack_ffffffffffffff9c;
  string local_60 [32];
  string local_40 [64];
  
  __lhs = local_120;
  ts<int>(in_stack_ffffffffffffff9c);
  std::operator+((char *)__lhs,in_RDI);
  ts<int>(in_stack_ffffffffffffff9c);
  std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  ts<int>(in_stack_ffffffffffffff9c);
  std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  ts<int>(in_stack_ffffffffffffff9c);
  std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  ts<int>(in_stack_ffffffffffffff9c);
  std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  ts<int>(in_stack_ffffffffffffff9c);
  std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  ts<int>(in_stack_ffffffffffffff9c);
  std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::__cxx11::string::operator=((string *)&in_RDI[1]._M_string_length,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  return;
}

Assistant:

void get_7(int a,int b,int c,int d,int e,int f,int g) { v_="get_7" + ts(a)+ts(b)+ts(c)+ts(d)+ts(e)+ts(f)+ts(g); }